

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall
duckdb::BaseAppender::AppendValueInternal<float,signed_char>
          (BaseAppender *this,Vector *col,float input)

{
  bool bVar1;
  InvalidInputException *this_00;
  duckdb *this_01;
  char result;
  data_t local_3d;
  float local_3c;
  string local_38;
  
  this_01 = (duckdb *)0x0;
  local_3c = input;
  bVar1 = TryCast::Operation<float,signed_char>(input,(int8_t *)&local_3d,false);
  if (bVar1) {
    col->data[(this->chunk).count] = local_3d;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<float,signed_char>(&local_38,this_01,local_3c);
  InvalidInputException::InvalidInputException(this_00,(string *)&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}